

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O3

void __thiscall rtosc::UndoHistory::showHistory(UndoHistory *this)

{
  UndoHistoryImpl *pUVar1;
  _Elt_pointer ppVar2;
  char *msg;
  char *pcVar3;
  _Map_pointer pppVar4;
  uint uVar5;
  _Elt_pointer ppVar6;
  _Elt_pointer ppVar7;
  rtosc_arg_t rVar8;
  
  pUVar1 = this->impl;
  ppVar7 = (pUVar1->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar2 = (pUVar1->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar7 != ppVar2) {
    ppVar6 = (pUVar1->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppVar4 = (pUVar1->history).
              super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    uVar5 = 0;
    do {
      msg = ppVar7->second;
      rVar8 = rtosc_argument(msg,0);
      pcVar3 = rtosc_argument_string(msg);
      printf("#%d type: %s dest: %s arguments: %s\n",(ulong)uVar5,msg,rVar8.d,pcVar3);
      ppVar7 = ppVar7 + 1;
      if (ppVar7 == ppVar6) {
        ppVar7 = pppVar4[1];
        pppVar4 = pppVar4 + 1;
        ppVar6 = ppVar7 + 0x20;
      }
      uVar5 = uVar5 + 1;
    } while (ppVar7 != ppVar2);
  }
  return;
}

Assistant:

void UndoHistory::showHistory(void) const
{
    int i = 0;
    for(auto s : impl->history)
        printf("#%d type: %s dest: %s arguments: %s\n", i++,
                s.second, rtosc_argument(s.second, 0).s, rtosc_argument_string(s.second));
}